

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O2

bool __thiscall
FIX::HostDetailsProvider::populateHostDetails
          (HostDetailsProvider *this,int n,Dictionary *d,HostDetails *out)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string suffix;
  string sourcePort;
  string sourceHost;
  string port;
  string host;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"SocketConnectHost",(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SocketConnectPort",(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"SocketConnectSourceHost",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"SocketConnectSourcePort",(allocator<char> *)&local_c0);
  if (0 < n) {
    std::__cxx11::to_string(&local_c0,n);
    std::__cxx11::string::append((string *)&local_40);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::append((string *)&local_80);
    std::__cxx11::string::append((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  bVar1 = Dictionary::has(d,&local_40);
  if (bVar1) {
    bVar1 = Dictionary::has(d,&local_60);
    if (bVar1) {
      Dictionary::getString(&local_c0,d,&local_40,false);
      std::__cxx11::string::operator=((string *)out,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      iVar3 = Dictionary::getInt(d,&local_60);
      out->port = (short)iVar3;
      bVar1 = Dictionary::has(d,&local_80);
      if (bVar1) {
        Dictionary::getString(&local_c0,d,&local_80,false);
        std::__cxx11::string::operator=((string *)&out->sourceAddress,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      bVar2 = Dictionary::has(d,&local_a0);
      bVar1 = true;
      if (bVar2) {
        iVar3 = Dictionary::getInt(d,&local_a0);
        out->sourcePort = (short)iVar3;
      }
      goto LAB_0018a58b;
    }
  }
  bVar1 = false;
LAB_0018a58b:
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool FIX::HostDetailsProvider::populateHostDetails(int n, const Dictionary &d, HostDetails &out) {
  std::string host = SOCKET_CONNECT_HOST;
  std::string port = SOCKET_CONNECT_PORT;
  std::string sourceHost = SOCKET_CONNECT_SOURCE_HOST;
  std::string sourcePort = SOCKET_CONNECT_SOURCE_PORT;

  if (n > 0) {
    std::string suffix = std::to_string(n);
    host += suffix;
    port += suffix;
    sourceHost += suffix;
    sourcePort += suffix;
  }

  if (d.has(host) && d.has(port)) {
    out.address = d.getString(host);
    out.port = (short)d.getInt(port);

    if (d.has(sourceHost)) {
      out.sourceAddress = d.getString(sourceHost);
    }

    if (d.has(sourcePort)) {
      out.sourcePort = (short)d.getInt(sourcePort);
    }

    return true;
  }
  return false;
}